

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O3

HighsInt Highs_addLinearObjective
                   (void *highs,double weight,double offset,double *coefficients,
                   double abs_tolerance,double rel_tolerance,HighsInt priority)

{
  HighsStatus HVar1;
  long lVar2;
  HighsLinearObjective linear_objective;
  undefined1 local_68 [16];
  pointer local_58;
  iterator iStack_50;
  double *local_48;
  double local_40;
  double local_38;
  HighsInt local_30;
  
  local_58 = (pointer)0x0;
  iStack_50._M_current = (double *)0x0;
  local_48 = (double *)0x0;
  lVar2 = (long)*(int *)((long)highs + 0x138);
  local_68._8_8_ = offset;
  if (0 < lVar2) {
    local_68._0_8_ = weight;
    do {
      if (iStack_50._M_current == local_48) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_58,iStack_50,coefficients);
      }
      else {
        *iStack_50._M_current = *coefficients;
        iStack_50._M_current = iStack_50._M_current + 1;
      }
      coefficients = coefficients + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  local_68._0_8_ = weight;
  local_40 = abs_tolerance;
  local_38 = rel_tolerance;
  local_30 = priority;
  HVar1 = Highs::addLinearObjective((Highs *)highs,(HighsLinearObjective *)local_68,-1);
  if (local_58 != (pointer)0x0) {
    operator_delete(local_58);
  }
  return HVar1;
}

Assistant:

HighsInt Highs_addLinearObjective(const void* highs, const double weight,
                                  const double offset,
                                  const double* coefficients,
                                  const double abs_tolerance,
                                  const double rel_tolerance,
                                  const HighsInt priority) {
  HighsLinearObjective linear_objective;
  HighsInt num_col = Highs_getNumCol(highs);
  linear_objective.weight = weight;
  linear_objective.offset = offset;
  for (HighsInt iCol = 0; iCol < num_col; iCol++)
    linear_objective.coefficients.push_back(coefficients[iCol]);
  linear_objective.abs_tolerance = abs_tolerance;
  linear_objective.rel_tolerance = rel_tolerance;
  linear_objective.priority = priority;
  linear_objective.weight = weight;
  return HighsInt(((Highs*)highs)->addLinearObjective(linear_objective));
}